

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall
duckdb::BaseAppender::AppendValueInternal<int,unsigned_int>
          (BaseAppender *this,Vector *col,int input)

{
  uint uVar1;
  
  uVar1 = Cast::Operation<int,unsigned_int>(input);
  *(uint *)(col->data + (this->chunk).count * 4) = uVar1;
  return;
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}